

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall
QHttpThreadDelegate::finishedWithErrorSlot
          (QHttpThreadDelegate *this,NetworkError errorCode,QString *detail)

{
  long lVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  QHttpThreadDelegate *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffc8;
  ConnectionType c;
  undefined4 in_stack_ffffffffffffffe0;
  QHttpThreadDelegate *obj;
  
  c = (ConnectionType)((ulong)in_RDX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->httpReply != (QHttpNetworkReply *)0x0) {
    obj = in_RDI;
    if (((ulong)((QHttpNetworkHeader *)&in_RDI->ssl)->_vptr_QHttpNetworkHeader & 1) != 0) {
      QHttpNetworkReply::sslConfiguration((QHttpNetworkReply *)in_RDI);
      sslConfigurationChanged(in_RDI,(QSslConfiguration *)in_stack_ffffffffffffffc8);
      QSslConfiguration::~QSslConfiguration((QSslConfiguration *)0x30f0d7);
    }
    error(in_RDI,c,in_stack_ffffffffffffffc8);
    downloadFinished((QHttpThreadDelegate *)0x30f0f4);
    QMetaObject::invokeMethod<>
              (&obj->super_QObject,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),c);
    QMetaObject::invokeMethod<>
              (&obj->super_QObject,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),c);
    in_RDI->httpReply = (QHttpNetworkReply *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpThreadDelegate::finishedWithErrorSlot(QNetworkReply::NetworkError errorCode, const QString &detail)
{
    if (!httpReply)
        return;

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::finishedWithErrorSlot() thread=" << QThread::currentThreadId() << "error=" << errorCode << detail;
#endif

#ifndef QT_NO_SSL
    if (ssl)
        emit sslConfigurationChanged(httpReply->sslConfiguration());
#endif
    emit error(errorCode,detail);
    emit downloadFinished();


    QMetaObject::invokeMethod(httpReply, "deleteLater", Qt::QueuedConnection);
    QMetaObject::invokeMethod(this, "deleteLater", Qt::QueuedConnection);
    httpReply = nullptr;
}